

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

void __thiscall fasttext::FastText::getSubwordVector(FastText *this,Vector *vec,string *subword)

{
  string_view str;
  uint32_t uVar1;
  element_type *peVar2;
  char *pcVar3;
  string *in_RDX;
  Dictionary *in_RDI;
  int32_t h;
  int32_t ind;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  
  Vector::zero((Vector *)in_RDI);
  peVar2 = std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1b8935);
  ind = (int32_t)((ulong)peVar2 >> 0x20);
  pcVar3 = (char *)std::__cxx11::string::operator_cast_to_basic_string_view(in_RDX);
  str._M_len._4_4_ = in_stack_ffffffffffffffcc;
  str._M_len._0_4_ = in_stack_ffffffffffffffc8;
  str._M_str = pcVar3;
  uVar1 = Dictionary::hash(in_RDI,str);
  std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1b8970);
  peVar2 = std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1b8999);
  Dictionary::nwords(peVar2);
  addInputVector((FastText *)in_RDI,(Vector *)CONCAT44(uVar1,in_stack_ffffffffffffffb8),ind);
  return;
}

Assistant:

void FastText::getSubwordVector(Vector& vec, const std::string& subword) const {
  vec.zero();
  int32_t h = dict_->hash(subword) % args_->bucket;
  h = h + dict_->nwords();
  addInputVector(vec, h);
}